

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::NetParameter::ByteSizeLong(NetParameter *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  V1LayerParameter *value;
  size_t sVar4;
  string *psVar5;
  size_t sVar6;
  BlobShape *value_00;
  LayerParameter *value_01;
  uint local_60;
  int cached_size;
  uint i_3;
  uint count_2;
  uint i_2;
  uint count_1;
  size_t data_size;
  int n;
  int i_1;
  uint i;
  uint count;
  size_t total_size;
  NetParameter *this_local;
  
  _i = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = NetParameter::unknown_fields(this);
    _i = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = layers_size(this);
  _i = uVar2 + _i;
  for (n = 0; (uint)n < uVar2; n = n + 1) {
    value = layers(this,n);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<caffe::V1LayerParameter>(value);
    _i = sVar4 + _i;
  }
  iVar3 = input_size(this);
  sVar4 = google::protobuf::internal::FromIntSize(iVar3);
  _i = sVar4 + _i;
  data_size._4_4_ = 0;
  iVar3 = input_size(this);
  for (; data_size._4_4_ < iVar3; data_size._4_4_ = data_size._4_4_ + 1) {
    psVar5 = input_abi_cxx11_(this,data_size._4_4_);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    _i = sVar4 + _i;
  }
  sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(&this->input_dim_);
  iVar3 = input_dim_size(this);
  sVar6 = google::protobuf::internal::FromIntSize(iVar3);
  uVar2 = input_shape_size(this);
  _i = (ulong)uVar2 + sVar4 + sVar6 + _i;
  for (i_3 = 0; i_3 < uVar2; i_3 = i_3 + 1) {
    value_00 = input_shape(this,i_3);
    sVar4 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::BlobShape>
                      (value_00);
    _i = sVar4 + _i;
  }
  uVar2 = layer_size(this);
  _i = (ulong)uVar2 * 2 + _i;
  for (local_60 = 0; local_60 < uVar2; local_60 = local_60 + 1) {
    value_01 = layer(this,local_60);
    sVar4 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::LayerParameter>
                      (value_01);
    _i = sVar4 + _i;
  }
  if (((this->_has_bits_).has_bits_[0] & 0xf) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar5 = name_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_state(this);
    if (bVar1) {
      sVar4 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::NetState>
                        (this->state_);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_force_backward(this);
    if (bVar1) {
      _i = _i + 2;
    }
    bVar1 = has_debug_info(this);
    if (bVar1) {
      _i = _i + 2;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t NetParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.NetParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .caffe.V1LayerParameter layers = 2;
  {
    unsigned int count = this->layers_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->layers(i));
    }
  }

  // repeated string input = 3;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->input_size());
  for (int i = 0, n = this->input_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->input(i));
  }

  // repeated int32 input_dim = 4;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->input_dim_);
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->input_dim_size());
    total_size += data_size;
  }

  // repeated .caffe.BlobShape input_shape = 8;
  {
    unsigned int count = this->input_shape_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->input_shape(i));
    }
  }

  // repeated .caffe.LayerParameter layer = 100;
  {
    unsigned int count = this->layer_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->layer(i));
    }
  }

  if (_has_bits_[0 / 32] & 15u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .caffe.NetState state = 6;
    if (has_state()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->state_);
    }

    // optional bool force_backward = 5 [default = false];
    if (has_force_backward()) {
      total_size += 1 + 1;
    }

    // optional bool debug_info = 7 [default = false];
    if (has_debug_info()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}